

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test62(void)

{
  reference pvVar1;
  size_type sVar2;
  allocator<char> local_2d41;
  string local_2d40;
  string local_2d20;
  allocator<char> local_2cf9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2cb8;
  _CM_DEBUG_FAILURE_REASON local_2c98;
  allocator<char> local_2c91;
  string local_2c90;
  string local_2c70;
  allocator<char> local_2c49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c08;
  int local_2be8;
  allocator<char> local_2be1;
  string local_2be0;
  string local_2bc0;
  allocator<char> local_2b99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b58;
  int local_2b38;
  allocator<char> local_2b31;
  string local_2b30;
  string local_2b10;
  allocator<char> local_2ae9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2aa8;
  _CM_DEBUG_FAILURE_REASON local_2a88;
  allocator<char> local_2a81;
  string local_2a80;
  string local_2a60;
  allocator<char> local_2a39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29f8;
  int local_29d8;
  allocator<char> local_29d1;
  string local_29d0;
  string local_29b0;
  allocator<char> local_2989;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2948;
  int local_2928;
  allocator<char> local_2921;
  string local_2920;
  string local_2900;
  allocator<char> local_28d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2898;
  _CM_DEBUG_FAILURE_REASON local_2878;
  allocator<char> local_2871;
  string local_2870;
  string local_2850;
  allocator<char> local_2829;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27e8;
  int local_27c8;
  allocator<char> local_27c1;
  string local_27c0;
  string local_27a0;
  allocator<char> local_2779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2738;
  int local_2718;
  allocator<char> local_2711;
  string local_2710;
  string local_26f0;
  allocator<char> local_26c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2688;
  _CM_DEBUG_FAILURE_REASON local_2668;
  allocator<char> local_2661;
  string local_2660;
  string local_2640;
  allocator<char> local_2619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d8;
  int local_25b8;
  allocator<char> local_25b1;
  string local_25b0;
  string local_2590;
  allocator<char> local_2569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2528;
  int local_2508;
  allocator<char> local_2501;
  string local_2500;
  string local_24e0;
  allocator<char> local_24b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2478;
  _CM_DEBUG_FAILURE_REASON local_2458;
  allocator<char> local_2451;
  string local_2450;
  string local_2430;
  allocator<char> local_2409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c8;
  int local_23a8;
  allocator<char> local_23a1;
  string local_23a0;
  string local_2380;
  allocator<char> local_2359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2318;
  int local_22f4;
  int local_22f0;
  allocator<char> local_22e9;
  int x;
  string local_22c8;
  allocator<char> local_22a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2260;
  size_type local_2240;
  int local_2234;
  CMReturn local_2230;
  pointer local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  allocator<char> local_21e1;
  string local_21e0;
  allocator<char> local_21b9;
  string local_21b8;
  undefined1 auStack_2198 [8];
  vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> failures;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2178;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2140;
  undefined1 local_2128 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  char *local_f0;
  char *local_e8;
  pair<const_char_*,_const_char_*> local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  char *local_80;
  char *local_78;
  pair<const_char_*,_const_char_*> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_78 = "N";
  local_80 = "/\\/";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            (&local_70,&local_78,&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_60,&local_70);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_20,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  local_e8 = "I";
  local_f0 = "/";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            (&local_e0,&local_e8,&local_f0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_d0,&local_e0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_20,&local_d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_d0);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2140,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_2178._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_2178._M_h._M_rehash_policy._4_4_ = 0;
  local_2178._M_h._M_rehash_policy._M_next_resize = 0;
  local_2178._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2178._M_h._M_element_count = 0;
  local_2178._M_h._M_buckets = (__buckets_ptr)0x0;
  local_2178._M_h._M_bucket_count = 0;
  local_2178._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_2178);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2128,&local_2140,&local_2178,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_2178);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2140);
  auStack_2198 = (undefined1  [8])0x0;
  failures.super__Vector_base<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  failures.super__Vector_base<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::vector
            ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b8,"I/\\/AM",&local_21b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21e0,"INAN",&local_21e1);
  local_21f8 = 0;
  uStack_21f0 = 0;
  local_2208 = 0;
  uStack_2200 = 1000000;
  local_2218 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2210 = 0;
  ConfusableMatcher::IndexOfDebugFailures
            (&local_2230,(ConfusableMatcher *)local_2128,&local_21b8,&local_21e0,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,ZEXT824(matcher.TheMap[0xff].
                                                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
                     ),(vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198);
  std::__cxx11::string::~string((string *)&local_21e0);
  std::allocator<char>::~allocator(&local_21e1);
  std::__cxx11::string::~string((string *)&local_21b8);
  std::allocator<char>::~allocator(&local_21b9);
  local_2234 = 5;
  local_2240 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::size
                         ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22a0,"Test62",&local_22a1);
  std::operator+(&local_2280,&local_22a0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&x,"5 == failures.size()",&local_22e9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_22c8,(string *)&x);
  std::operator+(&local_2260,&local_2280,&local_22c8);
  cute::assert_equal<int,unsigned_long>
            (&local_2234,&local_2240,&local_2260,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x61e);
  std::__cxx11::string::~string((string *)&local_2260);
  std::__cxx11::string::~string((string *)&local_22c8);
  std::__cxx11::string::~string((string *)&x);
  std::allocator<char>::~allocator(&local_22e9);
  std::__cxx11::string::~string((string *)&local_2280);
  std::__cxx11::string::~string((string *)&local_22a0);
  std::allocator<char>::~allocator(&local_22a1);
  local_22f0 = 0;
  local_22f4 = 5;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2358,"Test62",&local_2359);
  std::operator+(&local_2338,&local_2358,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23a0,"5 == failures[x].InPos",&local_23a1);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2380,&local_23a0);
  std::operator+(&local_2318,&local_2338,&local_2380);
  cute::assert_equal<int,unsigned_long>
            (&local_22f4,&pvVar1->InPos,&local_2318,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x621);
  std::__cxx11::string::~string((string *)&local_2318);
  std::__cxx11::string::~string((string *)&local_2380);
  std::__cxx11::string::~string((string *)&local_23a0);
  std::allocator<char>::~allocator(&local_23a1);
  std::__cxx11::string::~string((string *)&local_2338);
  std::__cxx11::string::~string((string *)&local_2358);
  std::allocator<char>::~allocator(&local_2359);
  local_23a8 = 3;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2408,"Test62",&local_2409);
  std::operator+(&local_23e8,&local_2408,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2450,"3 == failures[x].ContainsPos",&local_2451);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2430,&local_2450);
  std::operator+(&local_23c8,&local_23e8,&local_2430);
  cute::assert_equal<int,unsigned_long>
            (&local_23a8,&pvVar1->ContainsPos,&local_23c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x622);
  std::__cxx11::string::~string((string *)&local_23c8);
  std::__cxx11::string::~string((string *)&local_2430);
  std::__cxx11::string::~string((string *)&local_2450);
  std::allocator<char>::~allocator(&local_2451);
  std::__cxx11::string::~string((string *)&local_23e8);
  std::__cxx11::string::~string((string *)&local_2408);
  std::allocator<char>::~allocator(&local_2409);
  local_2458 = DEBUG_FAILURE_REASON_NO_NEW_PATHS;
  sVar2 = (size_type)local_22f0;
  local_22f0 = local_22f0 + 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      sVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24b8,"Test62",&local_24b9);
  std::operator+(&local_2498,&local_24b8,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2500,"DEBUG_FAILURE_REASON_NO_NEW_PATHS == failures[x++].Reason",
             &local_2501);
  cute::cute_to_string::backslashQuoteTabNewline(&local_24e0,&local_2500);
  std::operator+(&local_2478,&local_2498,&local_24e0);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2458,&pvVar1->Reason,&local_2478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x623);
  std::__cxx11::string::~string((string *)&local_2478);
  std::__cxx11::string::~string((string *)&local_24e0);
  std::__cxx11::string::~string((string *)&local_2500);
  std::allocator<char>::~allocator(&local_2501);
  std::__cxx11::string::~string((string *)&local_2498);
  std::__cxx11::string::~string((string *)&local_24b8);
  std::allocator<char>::~allocator(&local_24b9);
  local_2508 = 2;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2568,"Test62",&local_2569);
  std::operator+(&local_2548,&local_2568,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25b0,"2 == failures[x].InPos",&local_25b1);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2590,&local_25b0);
  std::operator+(&local_2528,&local_2548,&local_2590);
  cute::assert_equal<int,unsigned_long>
            (&local_2508,&pvVar1->InPos,&local_2528,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x625);
  std::__cxx11::string::~string((string *)&local_2528);
  std::__cxx11::string::~string((string *)&local_2590);
  std::__cxx11::string::~string((string *)&local_25b0);
  std::allocator<char>::~allocator(&local_25b1);
  std::__cxx11::string::~string((string *)&local_2548);
  std::__cxx11::string::~string((string *)&local_2568);
  std::allocator<char>::~allocator(&local_2569);
  local_25b8 = 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2618,"Test62",&local_2619);
  std::operator+(&local_25f8,&local_2618,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2660,"1 == failures[x].ContainsPos",&local_2661);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2640,&local_2660);
  std::operator+(&local_25d8,&local_25f8,&local_2640);
  cute::assert_equal<int,unsigned_long>
            (&local_25b8,&pvVar1->ContainsPos,&local_25d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x626);
  std::__cxx11::string::~string((string *)&local_25d8);
  std::__cxx11::string::~string((string *)&local_2640);
  std::__cxx11::string::~string((string *)&local_2660);
  std::allocator<char>::~allocator(&local_2661);
  std::__cxx11::string::~string((string *)&local_25f8);
  std::__cxx11::string::~string((string *)&local_2618);
  std::allocator<char>::~allocator(&local_2619);
  local_2668 = DEBUG_FAILURE_REASON_NO_PATH;
  sVar2 = (size_type)local_22f0;
  local_22f0 = local_22f0 + 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      sVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_26c8,"Test62",&local_26c9);
  std::operator+(&local_26a8,&local_26c8,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2710,"DEBUG_FAILURE_REASON_NO_PATH == failures[x++].Reason",
             &local_2711);
  cute::cute_to_string::backslashQuoteTabNewline(&local_26f0,&local_2710);
  std::operator+(&local_2688,&local_26a8,&local_26f0);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2668,&pvVar1->Reason,&local_2688,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x627);
  std::__cxx11::string::~string((string *)&local_2688);
  std::__cxx11::string::~string((string *)&local_26f0);
  std::__cxx11::string::~string((string *)&local_2710);
  std::allocator<char>::~allocator(&local_2711);
  std::__cxx11::string::~string((string *)&local_26a8);
  std::__cxx11::string::~string((string *)&local_26c8);
  std::allocator<char>::~allocator(&local_26c9);
  local_2718 = 2;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2778,"Test62",&local_2779);
  std::operator+(&local_2758,&local_2778,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27c0,"2 == failures[x].InPos",&local_27c1);
  cute::cute_to_string::backslashQuoteTabNewline(&local_27a0,&local_27c0);
  std::operator+(&local_2738,&local_2758,&local_27a0);
  cute::assert_equal<int,unsigned_long>
            (&local_2718,&pvVar1->InPos,&local_2738,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x629);
  std::__cxx11::string::~string((string *)&local_2738);
  std::__cxx11::string::~string((string *)&local_27a0);
  std::__cxx11::string::~string((string *)&local_27c0);
  std::allocator<char>::~allocator(&local_27c1);
  std::__cxx11::string::~string((string *)&local_2758);
  std::__cxx11::string::~string((string *)&local_2778);
  std::allocator<char>::~allocator(&local_2779);
  local_27c8 = 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2828,"Test62",&local_2829);
  std::operator+(&local_2808,&local_2828,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2870,"1 == failures[x].ContainsPos",&local_2871);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2850,&local_2870);
  std::operator+(&local_27e8,&local_2808,&local_2850);
  cute::assert_equal<int,unsigned_long>
            (&local_27c8,&pvVar1->ContainsPos,&local_27e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x62a);
  std::__cxx11::string::~string((string *)&local_27e8);
  std::__cxx11::string::~string((string *)&local_2850);
  std::__cxx11::string::~string((string *)&local_2870);
  std::allocator<char>::~allocator(&local_2871);
  std::__cxx11::string::~string((string *)&local_2808);
  std::__cxx11::string::~string((string *)&local_2828);
  std::allocator<char>::~allocator(&local_2829);
  local_2878 = DEBUG_FAILURE_REASON_NO_PATH;
  sVar2 = (size_type)local_22f0;
  local_22f0 = local_22f0 + 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      sVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28d8,"Test62",&local_28d9);
  std::operator+(&local_28b8,&local_28d8,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2920,"DEBUG_FAILURE_REASON_NO_PATH == failures[x++].Reason",
             &local_2921);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2900,&local_2920);
  std::operator+(&local_2898,&local_28b8,&local_2900);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2878,&pvVar1->Reason,&local_2898,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x62b);
  std::__cxx11::string::~string((string *)&local_2898);
  std::__cxx11::string::~string((string *)&local_2900);
  std::__cxx11::string::~string((string *)&local_2920);
  std::allocator<char>::~allocator(&local_2921);
  std::__cxx11::string::~string((string *)&local_28b8);
  std::__cxx11::string::~string((string *)&local_28d8);
  std::allocator<char>::~allocator(&local_28d9);
  local_2928 = 4;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2988,"Test62",&local_2989);
  std::operator+(&local_2968,&local_2988,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29d0,"4 == failures[x].InPos",&local_29d1);
  cute::cute_to_string::backslashQuoteTabNewline(&local_29b0,&local_29d0);
  std::operator+(&local_2948,&local_2968,&local_29b0);
  cute::assert_equal<int,unsigned_long>
            (&local_2928,&pvVar1->InPos,&local_2948,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x62d);
  std::__cxx11::string::~string((string *)&local_2948);
  std::__cxx11::string::~string((string *)&local_29b0);
  std::__cxx11::string::~string((string *)&local_29d0);
  std::allocator<char>::~allocator(&local_29d1);
  std::__cxx11::string::~string((string *)&local_2968);
  std::__cxx11::string::~string((string *)&local_2988);
  std::allocator<char>::~allocator(&local_2989);
  local_29d8 = 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a38,"Test62",&local_2a39);
  std::operator+(&local_2a18,&local_2a38,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a80,"1 == failures[x].ContainsPos",&local_2a81);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2a60,&local_2a80);
  std::operator+(&local_29f8,&local_2a18,&local_2a60);
  cute::assert_equal<int,unsigned_long>
            (&local_29d8,&pvVar1->ContainsPos,&local_29f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x62e);
  std::__cxx11::string::~string((string *)&local_29f8);
  std::__cxx11::string::~string((string *)&local_2a60);
  std::__cxx11::string::~string((string *)&local_2a80);
  std::allocator<char>::~allocator(&local_2a81);
  std::__cxx11::string::~string((string *)&local_2a18);
  std::__cxx11::string::~string((string *)&local_2a38);
  std::allocator<char>::~allocator(&local_2a39);
  local_2a88 = DEBUG_FAILURE_REASON_NO_PATH;
  sVar2 = (size_type)local_22f0;
  local_22f0 = local_22f0 + 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      sVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2ae8,"Test62",&local_2ae9);
  std::operator+(&local_2ac8,&local_2ae8,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b30,"DEBUG_FAILURE_REASON_NO_PATH == failures[x++].Reason",
             &local_2b31);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2b10,&local_2b30);
  std::operator+(&local_2aa8,&local_2ac8,&local_2b10);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2a88,&pvVar1->Reason,&local_2aa8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x62f);
  std::__cxx11::string::~string((string *)&local_2aa8);
  std::__cxx11::string::~string((string *)&local_2b10);
  std::__cxx11::string::~string((string *)&local_2b30);
  std::allocator<char>::~allocator(&local_2b31);
  std::__cxx11::string::~string((string *)&local_2ac8);
  std::__cxx11::string::~string((string *)&local_2ae8);
  std::allocator<char>::~allocator(&local_2ae9);
  local_2b38 = 6;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b98,"Test62",&local_2b99);
  std::operator+(&local_2b78,&local_2b98,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2be0,"6 == failures[x].InPos",&local_2be1);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2bc0,&local_2be0);
  std::operator+(&local_2b58,&local_2b78,&local_2bc0);
  cute::assert_equal<int,unsigned_long>
            (&local_2b38,&pvVar1->InPos,&local_2b58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x631);
  std::__cxx11::string::~string((string *)&local_2b58);
  std::__cxx11::string::~string((string *)&local_2bc0);
  std::__cxx11::string::~string((string *)&local_2be0);
  std::allocator<char>::~allocator(&local_2be1);
  std::__cxx11::string::~string((string *)&local_2b78);
  std::__cxx11::string::~string((string *)&local_2b98);
  std::allocator<char>::~allocator(&local_2b99);
  local_2be8 = 0;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      (long)local_22f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c48,"Test62",&local_2c49);
  std::operator+(&local_2c28,&local_2c48,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c90,"0 == failures[x].ContainsPos",&local_2c91);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2c70,&local_2c90);
  std::operator+(&local_2c08,&local_2c28,&local_2c70);
  cute::assert_equal<int,unsigned_long>
            (&local_2be8,&pvVar1->ContainsPos,&local_2c08,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x632);
  std::__cxx11::string::~string((string *)&local_2c08);
  std::__cxx11::string::~string((string *)&local_2c70);
  std::__cxx11::string::~string((string *)&local_2c90);
  std::allocator<char>::~allocator(&local_2c91);
  std::__cxx11::string::~string((string *)&local_2c28);
  std::__cxx11::string::~string((string *)&local_2c48);
  std::allocator<char>::~allocator(&local_2c49);
  local_2c98 = DEBUG_FAILURE_REASON_NO_PATH;
  sVar2 = (size_type)local_22f0;
  local_22f0 = local_22f0 + 1;
  pvVar1 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198,
                      sVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2cf8,"Test62",&local_2cf9);
  std::operator+(&local_2cd8,&local_2cf8,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d40,"DEBUG_FAILURE_REASON_NO_PATH == failures[x++].Reason",
             &local_2d41);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2d20,&local_2d40);
  std::operator+(&local_2cb8,&local_2cd8,&local_2d20);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2c98,&pvVar1->Reason,&local_2cb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x633);
  std::__cxx11::string::~string((string *)&local_2cb8);
  std::__cxx11::string::~string((string *)&local_2d20);
  std::__cxx11::string::~string((string *)&local_2d40);
  std::allocator<char>::~allocator(&local_2d41);
  std::__cxx11::string::~string((string *)&local_2cd8);
  std::__cxx11::string::~string((string *)&local_2cf8);
  std::allocator<char>::~allocator(&local_2cf9);
  std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::~vector
            ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_2198);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2128);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test62()
{
	std::vector<std::pair<std::string, std::string>> map;
	map.push_back(std::pair("N", "/\\/"));
	map.push_back(std::pair("I", "/"));

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = false;
	opts.MatchRepeating = true;
	opts.StartIndex = 0;

	auto matcher = ConfusableMatcher(map, { });
	auto failures = std::vector<CMDebugFailure>();

	matcher.IndexOfDebugFailures("I/\\/AM", "INAN", opts, &failures);

	ASSERT_EQUAL(5, failures.size());

	int x = 0;
	ASSERT_EQUAL(5, failures[x].InPos);
	ASSERT_EQUAL(3, failures[x].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_NEW_PATHS, failures[x++].Reason); // No new paths between AM and AN, M != N

	ASSERT_EQUAL(2, failures[x].InPos);
	ASSERT_EQUAL(1, failures[x].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_PATH, failures[x++].Reason); // Path end between /\ and IN, first I matches to I, repeats onto / and then N doesnt match with \/AM or I doesn't match with \

	ASSERT_EQUAL(2, failures[x].InPos);
	ASSERT_EQUAL(1, failures[x].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_PATH, failures[x++].Reason); // Inner matching from index 1, same situation as above

	ASSERT_EQUAL(4, failures[x].InPos);
	ASSERT_EQUAL(1, failures[x].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_PATH, failures[x++].Reason); // Path end between /A and IN, I matches with second / and then N doesn't match to A or I doesn't match with A

	ASSERT_EQUAL(6, failures[x].InPos);
	ASSERT_EQUAL(0, failures[x].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_PATH, failures[x++].Reason); // End of matching
}